

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

int setorientation(TIFFRGBAImage *img)

{
  int iVar1;
  ulong uVar2;
  ushort uVar3;
  undefined *puVar4;
  
  iVar1 = 0;
  switch(img->orientation) {
  case 1:
  case 5:
    uVar3 = img->req_orientation - 2;
    if (6 < uVar3) {
      return 0;
    }
    uVar2 = (ulong)uVar3;
    puVar4 = &DAT_0033379c;
    break;
  case 2:
  case 6:
    uVar3 = img->req_orientation - 1;
    if (7 < uVar3) {
      return 0;
    }
    uVar2 = (ulong)uVar3;
    puVar4 = &DAT_00333f94;
    break;
  case 3:
  case 7:
    uVar3 = img->req_orientation - 1;
    if (7 < uVar3) {
      return 0;
    }
    uVar2 = (ulong)uVar3;
    puVar4 = &DAT_00333fb4;
    break;
  case 4:
  case 8:
    uVar3 = img->req_orientation - 1;
    if (6 < uVar3) {
      return 0;
    }
    uVar2 = (ulong)uVar3;
    puVar4 = &DAT_003337b8;
    break;
  default:
    goto switchD_002a88ed_default;
  }
  iVar1 = *(int *)(puVar4 + uVar2 * 4);
switchD_002a88ed_default:
  return iVar1;
}

Assistant:

static int setorientation(TIFFRGBAImage *img)
{
    switch (img->orientation)
    {
        case ORIENTATION_TOPLEFT:
        case ORIENTATION_LEFTTOP:
            if (img->req_orientation == ORIENTATION_TOPRIGHT ||
                img->req_orientation == ORIENTATION_RIGHTTOP)
                return FLIP_HORIZONTALLY;
            else if (img->req_orientation == ORIENTATION_BOTRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTBOT)
                return FLIP_HORIZONTALLY | FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_BOTLEFT ||
                     img->req_orientation == ORIENTATION_LEFTBOT)
                return FLIP_VERTICALLY;
            else
                return 0;
        case ORIENTATION_TOPRIGHT:
        case ORIENTATION_RIGHTTOP:
            if (img->req_orientation == ORIENTATION_TOPLEFT ||
                img->req_orientation == ORIENTATION_LEFTTOP)
                return FLIP_HORIZONTALLY;
            else if (img->req_orientation == ORIENTATION_BOTRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTBOT)
                return FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_BOTLEFT ||
                     img->req_orientation == ORIENTATION_LEFTBOT)
                return FLIP_HORIZONTALLY | FLIP_VERTICALLY;
            else
                return 0;
        case ORIENTATION_BOTRIGHT:
        case ORIENTATION_RIGHTBOT:
            if (img->req_orientation == ORIENTATION_TOPLEFT ||
                img->req_orientation == ORIENTATION_LEFTTOP)
                return FLIP_HORIZONTALLY | FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_TOPRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTTOP)
                return FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_BOTLEFT ||
                     img->req_orientation == ORIENTATION_LEFTBOT)
                return FLIP_HORIZONTALLY;
            else
                return 0;
        case ORIENTATION_BOTLEFT:
        case ORIENTATION_LEFTBOT:
            if (img->req_orientation == ORIENTATION_TOPLEFT ||
                img->req_orientation == ORIENTATION_LEFTTOP)
                return FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_TOPRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTTOP)
                return FLIP_HORIZONTALLY | FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_BOTRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTBOT)
                return FLIP_HORIZONTALLY;
            else
                return 0;
        default: /* NOTREACHED */
            return 0;
    }
}